

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O0

double Cudd_zddCountDouble(DdManager *zdd,DdNode *P)

{
  DdNode *base_00;
  DdNode *empty_00;
  st__table *table_00;
  DdNode *empty;
  DdNode *base;
  double res;
  st__table *table;
  DdNode *P_local;
  DdManager *zdd_local;
  
  base_00 = zdd->one;
  empty_00 = zdd->zero;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    zdd_local = (DdManager *)0xbff0000000000000;
  }
  else {
    zdd_local = (DdManager *)cuddZddCountDoubleStep(P,table_00,base_00,empty_00);
    if (((double)zdd_local == -1.0) && (!NAN((double)zdd_local))) {
      zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table_00,st__zdd_count_dbl_free,(char *)0x0);
    st__free_table(table_00);
  }
  return (double)zdd_local;
}

Assistant:

double
Cudd_zddCountDouble(
  DdManager * zdd,
  DdNode * P)
{
    st__table    *table;
    double      res;
    DdNode      *base, *empty;

    base  = DD_ONE(zdd);
    empty = DD_ZERO(zdd);
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return((double)CUDD_OUT_OF_MEM);
    res = cuddZddCountDoubleStep(P, table, base, empty);
    if (res == (double)CUDD_OUT_OF_MEM) {
        zdd->errorCode = CUDD_MEMORY_OUT;
    }
    st__foreach(table, st__zdd_count_dbl_free, NIL(char));
    st__free_table(table);

    return(res);

}